

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O0

void __thiscall duckdb_shell::ModeJsonRenderer::Render(ModeJsonRenderer *this,RowResult *result)

{
  ShellState *in_RSI;
  long *in_RDI;
  
  if ((*(byte *)(in_RDI + 0xb) & 1) == 0) {
    if ((*(byte *)((long)in_RDI + 0x59) & 1) != 0) {
      ShellState::Print(in_RSI,(char *)in_RDI);
    }
    ShellState::Print(in_RSI,(char *)in_RDI);
  }
  else {
    if ((*(byte *)((long)in_RDI + 0x59) & 1) != 0) {
      ShellState::Print(in_RSI,(char *)in_RDI);
    }
    ShellState::Print(in_RSI,(char *)in_RDI);
    *(undefined1 *)(in_RDI + 0xb) = 0;
  }
  (**(code **)(*in_RDI + 0x20))(in_RDI,in_RSI);
  return;
}

Assistant:

void Render(RowResult &result) override {
		if (first_row) {
			if (json_array) {
				// wrap all JSON objects in an array
				state.Print("[");
			}
			state.Print("{");
			first_row = false;
		} else {
			if (json_array) {
				// wrap all JSON objects in an array
				state.Print(",");
			}
			state.Print("\n{");
		}
		RenderRow(result);
	}